

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Data * fts5DataRead(Fts5Index *p,i64 iRowid)

{
  sqlite3_blob *pBlob_00;
  u16 uVar1;
  int n;
  sqlite3_int64 nAlloc;
  Fts5Data *pFStack_40;
  int nByte;
  u8 *aOut;
  Fts5Config *pConfig;
  sqlite3_blob *pBlob;
  Fts5Data *pFStack_20;
  int rc;
  Fts5Data *pRet;
  i64 iRowid_local;
  Fts5Index *p_local;
  
  pFStack_20 = (Fts5Data *)0x0;
  if (p->rc == 0) {
    pBlob._4_4_ = 0;
    if (p->pReader != (sqlite3_blob *)0x0) {
      pBlob_00 = p->pReader;
      p->pReader = (sqlite3_blob *)0x0;
      pBlob._4_4_ = sqlite3_blob_reopen(pBlob_00,iRowid);
      p->pReader = pBlob_00;
      if (pBlob._4_4_ != 0) {
        fts5CloseReader(p);
      }
      if (pBlob._4_4_ == 4) {
        pBlob._4_4_ = 0;
      }
    }
    if ((p->pReader == (sqlite3_blob *)0x0) && (pBlob._4_4_ == 0)) {
      pBlob._4_4_ = sqlite3_blob_open(p->pConfig->db,p->pConfig->zDb,p->zDataTbl,"block",iRowid,0,
                                      &p->pReader);
    }
    if (pBlob._4_4_ == 1) {
      pBlob._4_4_ = 0x10b;
    }
    if (pBlob._4_4_ == 0) {
      pFStack_40 = (Fts5Data *)0x0;
      n = sqlite3_blob_bytes(p->pReader);
      pFStack_20 = (Fts5Data *)sqlite3_malloc64((long)n + 0x24);
      if (pFStack_20 == (Fts5Data *)0x0) {
        pBlob._4_4_ = 7;
      }
      else {
        pFStack_20->nn = n;
        pFStack_40 = pFStack_20 + 1;
        pFStack_20->p = (u8 *)pFStack_40;
      }
      if (pBlob._4_4_ == 0) {
        pBlob._4_4_ = sqlite3_blob_read(p->pReader,pFStack_40,n,0);
      }
      if (pBlob._4_4_ == 0) {
        pFStack_20->p[n] = '\0';
        uVar1 = fts5GetU16(pFStack_20->p + 2);
        pFStack_20->szLeaf = (uint)uVar1;
      }
      else {
        sqlite3_free(pFStack_20);
        pFStack_20 = (Fts5Data *)0x0;
      }
    }
    p->rc = pBlob._4_4_;
    p->nRead = p->nRead + 1;
  }
  return pFStack_20;
}

Assistant:

static Fts5Data *fts5DataRead(Fts5Index *p, i64 iRowid){
  Fts5Data *pRet = 0;
  if( p->rc==SQLITE_OK ){
    int rc = SQLITE_OK;

    if( p->pReader ){
      /* This call may return SQLITE_ABORT if there has been a savepoint
      ** rollback since it was last used. In this case a new blob handle
      ** is required.  */
      sqlite3_blob *pBlob = p->pReader;
      p->pReader = 0;
      rc = sqlite3_blob_reopen(pBlob, iRowid);
      assert( p->pReader==0 );
      p->pReader = pBlob;
      if( rc!=SQLITE_OK ){
        fts5CloseReader(p);
      }
      if( rc==SQLITE_ABORT ) rc = SQLITE_OK;
    }

    /* If the blob handle is not open at this point, open it and seek 
    ** to the requested entry.  */
    if( p->pReader==0 && rc==SQLITE_OK ){
      Fts5Config *pConfig = p->pConfig;
      rc = sqlite3_blob_open(pConfig->db, 
          pConfig->zDb, p->zDataTbl, "block", iRowid, 0, &p->pReader
      );
    }

    /* If either of the sqlite3_blob_open() or sqlite3_blob_reopen() calls
    ** above returned SQLITE_ERROR, return SQLITE_CORRUPT_VTAB instead.
    ** All the reasons those functions might return SQLITE_ERROR - missing
    ** table, missing row, non-blob/text in block column - indicate 
    ** backing store corruption.  */
    if( rc==SQLITE_ERROR ) rc = FTS5_CORRUPT;

    if( rc==SQLITE_OK ){
      u8 *aOut = 0;               /* Read blob data into this buffer */
      int nByte = sqlite3_blob_bytes(p->pReader);
      sqlite3_int64 nAlloc = sizeof(Fts5Data) + nByte + FTS5_DATA_PADDING;
      pRet = (Fts5Data*)sqlite3_malloc64(nAlloc);
      if( pRet ){
        pRet->nn = nByte;
        aOut = pRet->p = (u8*)&pRet[1];
      }else{
        rc = SQLITE_NOMEM;
      }

      if( rc==SQLITE_OK ){
        rc = sqlite3_blob_read(p->pReader, aOut, nByte, 0);
      }
      if( rc!=SQLITE_OK ){
        sqlite3_free(pRet);
        pRet = 0;
      }else{
        /* TODO1: Fix this */
        pRet->p[nByte] = 0x00;
        pRet->szLeaf = fts5GetU16(&pRet->p[2]);
      }
    }
    p->rc = rc;
    p->nRead++;
  }

  assert( (pRet==0)==(p->rc!=SQLITE_OK) );
  return pRet;
}